

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

FloorLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_floor(NeuralNetworkLayer *this)

{
  FloorLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x29e) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x29e;
    this_00 = (FloorLayerParams *)operator_new(0x18);
    FloorLayerParams::FloorLayerParams(this_00);
    (this->layer_).floor_ = this_00;
  }
  return (FloorLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FloorLayerParams* NeuralNetworkLayer::mutable_floor() {
  if (!has_floor()) {
    clear_layer();
    set_has_floor();
    layer_.floor_ = new ::CoreML::Specification::FloorLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.floor)
  return layer_.floor_;
}